

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float16 float16_scalbn_arm(float16 a,int n,float_status *status)

{
  float16 fVar1;
  FloatParts FVar2;
  
  FVar2 = float16_unpack_canonical(a,status);
  FVar2 = scalbn_decomposed(FVar2,n,status);
  fVar1 = float16_round_pack_canonical(FVar2,status);
  return fVar1;
}

Assistant:

float16 float16_scalbn(float16 a, int n, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pr = scalbn_decomposed(pa, n, status);
    return float16_round_pack_canonical(pr, status);
}